

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFactorySystem.cpp
# Opt level: O2

void __thiscall
ObjectFactorySystem::CompleteConstructorSwap
          (ObjectFactorySystem *this,ProtectedObjectSwapper *swapper)

{
  IObjectConstructor *pIVar1;
  byte bVar2;
  _Rb_tree_node_base *p_Var3;
  ulong uVar4;
  IObject *pObject;
  pointer ppIVar5;
  long *plVar6;
  undefined8 *puVar7;
  pointer ppIVar8;
  char *pcVar9;
  ICompilerLogger *pIVar10;
  PerTypeObjectId objId;
  ulong uVar11;
  size_t i;
  ulong uVar12;
  PerTypeObjectId objId_1;
  
  bVar2 = (swapper->super_RuntimeProtector).m_bHashadException;
  if (((bool)bVar2 != true) || (swapper->m_ProtectedPhase == PHASE_DELETEOLD)) {
    pIVar10 = this->m_pLogger;
    if (pIVar10 != (ICompilerLogger *)0x0) {
      (**(code **)(*(long *)pIVar10 + 0x10))(pIVar10,"Object swap completed\n");
      bVar2 = (swapper->super_RuntimeProtector).m_bHashadException;
    }
    if ((((bVar2 & 1) != 0) && (swapper->m_ProtectedPhase == PHASE_DELETEOLD)) &&
       (pIVar10 = this->m_pLogger, pIVar10 != (ICompilerLogger *)0x0)) {
      (*(code *)**(undefined8 **)pIVar10)
                (pIVar10,"Exception during object destruction of old objects, leaking.\n");
    }
    goto LAB_001173c4;
  }
  pIVar10 = this->m_pLogger;
  if (pIVar10 == (ICompilerLogger *)0x0) goto switchD_00117351_default;
  (*(code *)**(undefined8 **)pIVar10)
            (pIVar10,"Exception during object swapping, switching back to previous objects.\n");
  switch(swapper->m_ProtectedPhase) {
  case PHASE_NONE:
    goto switchD_00117351_default;
  case PHASE_SERIALIZEOUT:
    pIVar10 = this->m_pLogger;
    puVar7 = *(undefined8 **)pIVar10;
    pcVar9 = "\tError occured during serialize out old objects phase.\n";
    break;
  case PHASE_CONSTRUCTNEW:
    pIVar10 = this->m_pLogger;
    puVar7 = *(undefined8 **)pIVar10;
    pcVar9 = "\tError occured during constructing new objects phase.\n";
    break;
  case PHASE_SERIALIZEIN:
    pIVar10 = this->m_pLogger;
    puVar7 = *(undefined8 **)pIVar10;
    pcVar9 = "\tError occured during serialize into the new objects phase.\n";
    break;
  case PHASE_AUTOCONSTRUCTSINGLETONS:
    pIVar10 = this->m_pLogger;
    puVar7 = *(undefined8 **)pIVar10;
    pcVar9 = "\tError occured during auto construct singletons phase.\n";
    break;
  case PHASE_INITANDSERIALIZEOUTTEST:
    if (this->m_bTestSerialization == true) {
      pcVar9 = "\tError occured during Initialization and serialize test of new objects phase.\n";
    }
    else {
      pcVar9 = "\tError occured during Initialization phase.\n";
    }
    (*(code *)**(undefined8 **)this->m_pLogger)(this->m_pLogger,pcVar9);
  default:
    goto switchD_00117351_default;
  }
  (*(code *)*puVar7)(pIVar10,pcVar9);
switchD_00117351_default:
  std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>::operator=
            (&this->m_Constructors,&swapper->m_ConstructorsOld);
  if (swapper->m_ProtectedPhase != PHASE_SERIALIZEOUT) {
    (swapper->m_Serializer).m_bLoading = true;
    (swapper->m_Serializer).m_pCurrentObject = (IObject *)0x0;
    uVar12 = 0;
    while( true ) {
      ppIVar5 = (this->m_Constructors).
                super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppIVar8 = (this->m_Constructors).
                super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)((long)ppIVar8 - (long)ppIVar5 >> 3) <= uVar12) break;
      pIVar1 = ppIVar5[uVar12];
      for (uVar11 = 0; uVar4 = (**(code **)(*(long *)pIVar1 + 0x60))(pIVar1), uVar11 < uVar4;
          uVar11 = uVar11 + 1) {
        pObject = (IObject *)(**(code **)(*(long *)pIVar1 + 0x58))(pIVar1,uVar11);
        if (pObject != (IObject *)0x0) {
          SimpleSerializer::Serialize(&swapper->m_Serializer,pObject);
        }
      }
      uVar12 = uVar12 + 1;
    }
    for (uVar12 = 0; uVar12 < (ulong)((long)ppIVar8 - (long)ppIVar5 >> 3); uVar12 = uVar12 + 1) {
      pIVar1 = ppIVar5[uVar12];
      for (uVar11 = 0; uVar4 = (**(code **)(*(long *)pIVar1 + 0x60))(pIVar1), uVar11 < uVar4;
          uVar11 = uVar11 + 1) {
        plVar6 = (long *)(**(code **)(*(long *)pIVar1 + 0x58))(pIVar1,uVar11);
        if (plVar6 != (long *)0x0) {
          (**(code **)(*plVar6 + 0x18))(plVar6,0);
        }
      }
      ppIVar5 = (this->m_Constructors).
                super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppIVar8 = (this->m_Constructors).
                super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
LAB_001173c4:
  for (p_Var3 = *(_Rb_tree_node_base **)&this->field_0x68;
      p_Var3 != (_Rb_tree_node_base *)&this->field_0x58;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    (**(code **)**(undefined8 **)(p_Var3 + 1))();
  }
  return;
}

Assistant:

void ObjectFactorySystem::CompleteConstructorSwap( ProtectedObjectSwapper& swapper )
{
	if( swapper.HasHadException() && PHASE_DELETEOLD != swapper.m_ProtectedPhase )
	{
		if( m_pLogger )
		{
			m_pLogger->LogError( "Exception during object swapping, switching back to previous objects.\n" );
			switch( swapper.m_ProtectedPhase  )
			{
            case PHASE_NONE:
                AU_ASSERT( false );
                break;
			case PHASE_SERIALIZEOUT:
				m_pLogger->LogError( "\tError occured during serialize out old objects phase.\n" );
				break;
			case PHASE_CONSTRUCTNEW:
				m_pLogger->LogError( "\tError occured during constructing new objects phase.\n" );
				break;
			case PHASE_SERIALIZEIN:
				m_pLogger->LogError( "\tError occured during serialize into the new objects phase.\n" );
				break;
			case PHASE_AUTOCONSTRUCTSINGLETONS:
				m_pLogger->LogError( "\tError occured during auto construct singletons phase.\n" );
                break;
			case PHASE_INITANDSERIALIZEOUTTEST:
                if( m_bTestSerialization )
                {
				    m_pLogger->LogError( "\tError occured during Initialization and serialize test of new objects phase.\n" );
                }
                else
                {
				    m_pLogger->LogError( "\tError occured during Initialization phase.\n" );
                }
                break;
           case PHASE_DELETEOLD:
                break;
 			}
		}

		//swap back to new constructors before everything is serialized back in
		m_Constructors = swapper.m_ConstructorsOld;
		if( PHASE_SERIALIZEOUT != swapper.m_ProtectedPhase )
		{
			//serialize back with old objects - could cause exception which isn't handled, but hopefully not.
			swapper.m_Serializer.SetIsLoading( true );
			for( size_t i = 0; i < m_Constructors.size(); ++i )
			{
				IObjectConstructor* pConstructor = m_Constructors[i];
				for( PerTypeObjectId objId = 0; objId < pConstructor->GetNumberConstructedObjects(); ++ objId )
				{
					// Iserialize new object
					IObject* pObject = pConstructor->GetConstructedObject( objId );
					if (pObject)
					{
						swapper.m_Serializer.Serialize( pObject );
					}			
				}
			}

			// Do a second pass, initializing objects now that they've all been serialized
			for( size_t i = 0; i < m_Constructors.size(); ++i )
			{
				IObjectConstructor* pConstructor = m_Constructors[i];
				for( PerTypeObjectId objId = 0; objId < pConstructor->GetNumberConstructedObjects(); ++ objId )
				{
					IObject* pObject = pConstructor->GetConstructedObject( objId );
					if (pObject)
					{
						pObject->Init(false);
					}			
				}
			}
		}
	}
	else
	{
		if( m_pLogger ) m_pLogger->LogInfo( "Object swap completed\n");
		if( swapper.HasHadException() && PHASE_DELETEOLD == swapper.m_ProtectedPhase )
		{
			if( m_pLogger ) m_pLogger->LogError( "Exception during object destruction of old objects, leaking.\n" );
		}
	}

	// Notify any listeners that constructors have changed
	TObjectFactoryListeners::iterator it = m_Listeners.begin();
	TObjectFactoryListeners::iterator itEnd = m_Listeners.end();
	while (it != itEnd)
	{
		(*it)->OnConstructorsAdded();
		++it;
	}
}